

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

void __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::~CopyingFileInputStream
          (CopyingFileInputStream *this)

{
  bool bVar1;
  LogMessage local_20 [16];
  char *local_10;
  
  if (this->close_on_delete_ == true) {
    bVar1 = Close(this);
    if (!bVar1) {
      absl::lts_20240722::log_internal::LogMessage::LogMessage
                (local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0x5f);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (local_20,0x10,"close() failed: ");
      local_10 = strerror(this->errno_);
      absl::lts_20240722::log_internal::LogMessage::operator<<<char_*,_0>(local_20,&local_10);
      absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_20);
    }
  }
  return;
}

Assistant:

FileInputStream::CopyingFileInputStream::~CopyingFileInputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      ABSL_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}